

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall embree::StdStream::StdStream(StdStream *this,istream *cin,string *name)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__p;
  allocator_type local_29;
  
  (this->super_Stream<int>).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Stream_002c9638;
  (this->super_Stream<int>).start = 0;
  (this->super_Stream<int>).past = 0;
  (this->super_Stream<int>).future = 0;
  std::
  vector<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
  ::vector(&(this->super_Stream<int>).buffer,0x400,&local_29);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount = (_func_int **)&PTR__StdStream_002cb1a0;
  this->cin = cin;
  this->lineNumber = 1;
  this->colNumber = 0;
  this->charNumber = 0;
  __p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (__p->_M_dataplus)._M_p = (pointer)&__p->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__p,pcVar1,pcVar1 + name->_M_string_length);
  (this->name).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
            (&(this->name).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  return;
}

Assistant:

StdStream (std::istream& cin, const std::string& name = "std::stream")
      : cin(cin), lineNumber(1), colNumber(0), charNumber(0), name(std::shared_ptr<std::string>(new std::string(name))) {}